

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastZ32S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  ushort *puVar4;
  uint *puVar5;
  ulong hasbits_00;
  
  if (data.field_0._0_2_ != 0) {
    pcVar3 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  cVar1 = ptr[2];
  if (cVar1 < '\0') {
    pcVar3 = SingularVarBigint<int,unsigned_short,true>(msg,ptr + 2,ctx,data,table,hasbits_00);
    return pcVar3;
  }
  puVar5 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar5 & 3) != 0) {
LAB_002c531e:
    AlignFail(puVar5);
  }
  puVar4 = (ushort *)(ptr + 3);
  *puVar5 = -((int)cVar1 & 1U) ^ (uint)(int)cVar1 >> 1;
  if (puVar4 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar2 = (uint)table->fast_idx_mask & (uint)*puVar4;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar2 & 0xfffffff8)))();
    return pcVar3;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar5 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar5 & 3) != 0) goto LAB_002c531e;
    *puVar5 = *puVar5 | (uint)hasbits_00;
  }
  return (char *)puVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ32S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularVarint<int32_t, uint16_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}